

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O1

void __thiscall
cmFindLibraryCommand::AddArchitecturePath
          (cmFindLibraryCommand *this,string *dir,size_type start_pos,char *suffix,bool fresh)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  size_t sVar6;
  undefined7 in_register_00000081;
  string lib;
  string libX;
  string local_98;
  string local_78;
  undefined4 local_54;
  long *local_50 [2];
  long local_40 [2];
  
  local_54 = (undefined4)CONCAT71(in_register_00000081,fresh);
  lVar5 = std::__cxx11::string::find((char *)dir,0x58d30e,start_pos);
  if (lVar5 != -1) {
    std::__cxx11::string::substr((ulong)&local_98,(ulong)dir);
    bVar2 = cmsys::SystemTools::FileIsDirectory(&local_98);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_98._M_dataplus._M_p,
               local_98._M_dataplus._M_p + local_98._M_string_length);
    std::__cxx11::string::append((char *)&local_78);
    bVar3 = cmsys::SystemTools::FileIsDirectory(&local_78);
    if (bVar2 && bVar3) {
      bVar4 = cmLibDirsLinked(&local_78,&local_98);
      bVar3 = bVar3 && !bVar4;
    }
    if (bVar3 != false) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)dir);
      std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      sVar6 = strlen(suffix);
      AddArchitecturePath(this,&local_78,lVar5 + sVar6 + 4,suffix,true);
    }
    if (bVar2) {
      AddArchitecturePath(this,dir,lVar5 + 4,suffix,false);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  if ((char)local_54 != '\0') {
    bVar2 = cmsys::SystemTools::FileIsDirectory(dir);
    pcVar1 = (dir->_M_dataplus)._M_p;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar1,pcVar1 + dir->_M_string_length);
    std::__cxx11::string::append((char *)&local_98);
    bVar3 = cmsys::SystemTools::FileIsDirectory(&local_98);
    if (bVar2 && bVar3) {
      bVar4 = cmLibDirsLinked(&local_98,dir);
      bVar3 = bVar3 && !bVar4;
    }
    if (bVar3 != false) {
      std::__cxx11::string::append((char *)&local_98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->super_cmFindBase).super_cmFindCommon.SearchPaths,&local_98);
    }
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->super_cmFindBase).super_cmFindCommon.SearchPaths,dir);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmFindLibraryCommand::AddArchitecturePath(
  std::string const& dir, std::string::size_type start_pos, const char* suffix,
  bool fresh)
{
  std::string::size_type pos = dir.find("lib/", start_pos);

  if (pos != std::string::npos) {
    // Check for "lib".
    std::string lib = dir.substr(0, pos + 3);
    bool use_lib = cmSystemTools::FileIsDirectory(lib);

    // Check for "lib<suffix>" and use it first.
    std::string libX = lib + suffix;
    bool use_libX = cmSystemTools::FileIsDirectory(libX);

    // Avoid copies of the same directory due to symlinks.
    if (use_libX && use_lib && cmLibDirsLinked(libX, lib)) {
      use_libX = false;
    }

    if (use_libX) {
      libX += dir.substr(pos + 3);
      std::string::size_type libX_pos = pos + 3 + strlen(suffix) + 1;
      this->AddArchitecturePath(libX, libX_pos, suffix);
    }

    if (use_lib) {
      this->AddArchitecturePath(dir, pos + 3 + 1, suffix, false);
    }
  }

  if (fresh) {
    // Check for the original unchanged path.
    bool use_dir = cmSystemTools::FileIsDirectory(dir);

    // Check for <dir><suffix>/ and use it first.
    std::string dirX = dir + suffix;
    bool use_dirX = cmSystemTools::FileIsDirectory(dirX);

    // Avoid copies of the same directory due to symlinks.
    if (use_dirX && use_dir && cmLibDirsLinked(dirX, dir)) {
      use_dirX = false;
    }

    if (use_dirX) {
      dirX += "/";
      this->SearchPaths.push_back(dirX);
    }

    if (use_dir) {
      this->SearchPaths.push_back(dir);
    }
  }
}